

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QModelIndex * __thiscall
QListView::indexAt(QModelIndex *__return_storage_ptr__,QListView *this,QPoint *p)

{
  int *piVar1;
  int iVar2;
  QAbstractItemViewPrivate *this_00;
  QWidgetData *pQVar3;
  long *plVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char cVar7;
  int iVar8;
  LayoutDirection LVar9;
  ulong uVar10;
  uint uVar11;
  long in_FS_OFFSET;
  undefined1 local_98 [16];
  undefined1 local_88 [12];
  int iStack_7c;
  QAbstractItemModel *local_78;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  local_48 = 0xaaaaaaaa;
  iStack_44 = 0xaaaaaaaa;
  iStack_40 = 0xaaaaaaaa;
  iStack_3c = 0xaaaaaaaa;
  iVar2 = (p->xp).m_i;
  iVar8 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget + 0x2b0))(this);
  iVar8 = iVar8 + iVar2;
  iVar2 = (p->yp).m_i;
  iStack_44 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b8))(this);
  iStack_44 = iStack_44 + iVar2;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = iVar8;
  iStack_40 = iVar8;
  iStack_3c = iStack_44;
  if ((this_00->delayedPendingLayout == true) && (this_00->state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(this_00);
    (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
  LVar9 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  _local_88 = QRect::normalized();
  uVar10 = local_88._0_8_;
  if (LVar9 == RightToLeft) {
    pQVar3 = ((this_00->super_QAbstractScrollAreaPrivate).viewport)->data;
    iVar8 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
    iVar2 = *(int *)(*(long *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate + 0x18);
    if (iVar8 <= iVar2) {
      iVar8 = iVar2;
    }
    uVar11 = ~local_88._8_4_ + iVar8;
    unique0x1000039d =
         (undefined1 *)
         ((ulong)((local_88._8_4_ - local_88._0_4_) + uVar11) | local_88._8_8_ & 0xffffffff00000000)
    ;
    local_88._0_8_ = (ulong)uVar11 | uVar10 & 0xffffffff00000000;
  }
  plVar4 = *(long **)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                      super_QWidgetPrivate;
  (**(code **)(*plVar4 + 0x38))(&local_68,plVar4,local_88);
  auVar6._8_8_ = local_98._8_8_;
  auVar6._0_8_ = local_98._0_8_;
  auVar5._8_8_ = local_98._8_8_;
  auVar5._0_8_ = local_98._0_8_;
  if (local_58 == (undefined1 *)0x0) {
    local_88._0_4_ = -1;
    local_88._4_4_ = -1;
    local_88._8_4_ = 0;
    iStack_7c = 0;
    local_78 = (QAbstractItemModel *)0x0;
  }
  else {
    piVar1 = (int *)(puStack_60 + (long)local_58 * 0x18 + -0x18);
    local_88._0_4_ = *piVar1;
    local_88._4_4_ = piVar1[1];
    local_88._8_4_ = piVar1[2];
    iStack_7c = piVar1[3];
    local_78 = *(QAbstractItemModel **)(puStack_60 + (long)local_58 * 0x18 + -8);
  }
  if (((-1 < (int)local_88._0_4_) && (local_98 = auVar5, -1 < (int)local_88._4_4_)) &&
     (local_98 = auVar6, local_78 != (QAbstractItemModel *)0x0)) {
    local_98 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                      super_QFrame.super_QWidget + 0x1e0))(this,local_88);
    cVar7 = QRect::contains((QPoint *)local_98,SUB81(p,0));
    if (cVar7 != '\0') {
      (__return_storage_ptr__->m).ptr = local_78;
      __return_storage_ptr__->r = local_88._0_4_;
      __return_storage_ptr__->c = local_88._4_4_;
      *(undefined4 *)&__return_storage_ptr__->i = local_88._8_4_;
      *(int *)((long)&__return_storage_ptr__->i + 4) = iStack_7c;
      goto LAB_00576c9e;
    }
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
LAB_00576c9e:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,0x18,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QListView::indexAt(const QPoint &p) const
{
    Q_D(const QListView);
    QRect rect(p.x() + horizontalOffset(), p.y() + verticalOffset(), 1, 1);
    const QList<QModelIndex> intersectVector = d->intersectingSet(rect);
    QModelIndex index = intersectVector.size() > 0
                        ? intersectVector.last() : QModelIndex();
    if (index.isValid() && visualRect(index).contains(p))
        return index;
    return QModelIndex();
}